

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

string * __thiscall
google::protobuf::TextFormat::FieldValuePrinter::PrintMessageEnd_abi_cxx11_
          (FieldValuePrinter *this,Message *message,int field_index,int field_count,
          bool single_line_mode)

{
  string *psVar1;
  FastFieldValuePrinter *in_RSI;
  StringBaseTextGenerator *in_RDI;
  byte in_R9B;
  StringBaseTextGenerator generator;
  undefined8 in_stack_ffffffffffffff78;
  undefined1 single_line_mode_00;
  StringBaseTextGenerator *message_00;
  StringBaseTextGenerator local_50 [47];
  byte local_21;
  
  single_line_mode_00 = (undefined1)((ulong)in_stack_ffffffffffffff78 >> 0x38);
  local_21 = in_R9B & 1;
  message_00 = in_RDI;
  anon_unknown_19::StringBaseTextGenerator::StringBaseTextGenerator(in_RDI);
  FastFieldValuePrinter::PrintMessageEnd
            (in_RSI,(Message *)message_00,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
             (bool)single_line_mode_00,(BaseTextGenerator *)0x70935b);
  psVar1 = (anonymous_namespace)::StringBaseTextGenerator::Get_abi_cxx11_(local_50);
  std::__cxx11::string::string((string *)in_RDI,(string *)psVar1);
  anon_unknown_19::StringBaseTextGenerator::~StringBaseTextGenerator(in_RDI);
  return (string *)message_00;
}

Assistant:

std::string TextFormat::FieldValuePrinter::PrintMessageEnd(
    const Message& message, int field_index, int field_count,
    bool single_line_mode) const {
  FORWARD_IMPL(PrintMessageEnd, message, field_index, field_count,
               single_line_mode);
}